

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_ManSimPatResim(Gia_Man_t *pGia,Vec_Int_t *vObjs,int nWords,Vec_Wrd_t *vSims)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  word *pwVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  
  iVar1 = vObjs->nSize;
  if (0 < (long)iVar1) {
    piVar3 = vObjs->pArray;
    uVar9 = (ulong)(uint)nWords;
    lVar10 = 0;
    do {
      iVar2 = piVar3[lVar10];
      if (((long)iVar2 < 0) || (pGia->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      if (lVar10 == 0) {
        if (0 < nWords) {
          pwVar4 = vSims->pArray;
          uVar6 = 0;
          do {
            pwVar4[(long)(iVar2 * nWords) + uVar6] = ~pwVar4[(long)(iVar2 * nWords) + uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar9 != uVar6);
        }
      }
      else {
        uVar6 = *(ulong *)(pGia->pObjs + iVar2);
        uVar11 = (uint)uVar6;
        if ((uVar6 & 0x1fffffff) == 0x1fffffff || (int)uVar11 < 0) {
          if ((-1 < (int)uVar11) || ((int)(uVar6 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                          ,0x91,
                          "void Gia_ManSimPatResim(Gia_Man_t *, Vec_Int_t *, int, Vec_Wrd_t *)");
          }
        }
        else {
          pwVar4 = vSims->pArray;
          uVar5 = *(ulong *)((long)Cnf_CutDeriveTruth::C + (ulong)((uint)(uVar6 >> 0x1a) & 8));
          uVar12 = (uint)(uVar6 >> 0x20);
          uVar6 = Cnf_CutDeriveTruth::C[uVar12 >> 0x1d & 1];
          iVar7 = (iVar2 - (uVar11 & 0x1fffffff)) * nWords;
          uVar12 = uVar12 & 0x1fffffff;
          iVar8 = (iVar2 - uVar12) * nWords;
          if ((uVar11 & 0x1fffffff) < uVar12) {
            if (0 < nWords) {
              uVar13 = 0;
              do {
                pwVar4[(long)(iVar2 * nWords) + uVar13] =
                     uVar5 ^ uVar6 ^ pwVar4[(long)iVar7 + uVar13] ^ pwVar4[(long)iVar8 + uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar9 != uVar13);
            }
          }
          else if (0 < nWords) {
            uVar13 = 0;
            do {
              pwVar4[(long)(iVar2 * nWords) + uVar13] =
                   (pwVar4[(long)iVar8 + uVar13] ^ uVar6) & (pwVar4[(long)iVar7 + uVar13] ^ uVar5);
              uVar13 = uVar13 + 1;
            } while (uVar9 != uVar13);
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar1);
  }
  return;
}

Assistant:

void Gia_ManSimPatResim( Gia_Man_t * pGia, Vec_Int_t * vObjs, int nWords, Vec_Wrd_t * vSims )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachObjVec( vObjs, pGia, pObj, i )
        if ( i == 0 )
            Gia_ManSimPatSimNot( pGia, Gia_ObjId(pGia, pObj), pObj, nWords, vSims );
        else if ( Gia_ObjIsAnd(pObj) )
            Gia_ManSimPatSimAnd( pGia, Gia_ObjId(pGia, pObj), pObj, nWords, vSims );
        else if ( !Gia_ObjIsCo(pObj) ) assert(0);
}